

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t kratos::hash_var(Var *var)

{
  _func_int **pp_Var1;
  bool bVar2;
  VarType VVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  void *pvVar7;
  Var *local_78;
  uint64_t hash;
  string v_1;
  string v;
  Const *c;
  uint64_t op_hash;
  Expr *expr;
  Var *var_local;
  
  if (var == (Var *)0x0) {
    var_local = (Var *)0x0;
  }
  else {
    VVar3 = Var::type(var);
    if (VVar3 == Expression) {
      pp_Var1 = var[1].super_IRNode._vptr_IRNode;
      uVar5 = hash_var((Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      uVar6 = hash_var((Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      var_local = (Var *)(uVar5 ^ uVar6 ^ (ulong)pp_Var1);
    }
    else {
      VVar3 = Var::type(var);
      if (VVar3 == ConstValue) {
        var_local = (Var *)Const::value((Const *)var);
      }
      else {
        VVar3 = Var::type(var);
        if (VVar3 == Parameter) {
          (*(var->super_IRNode)._vptr_IRNode[0x1f])((undefined1 *)((long)&v_1.field_2 + 8));
          pvVar7 = (void *)std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::size();
          var_local = (Var *)hash_64_fnv1a(pvVar7,uVar5);
          std::__cxx11::string::~string((string *)(v_1.field_2._M_local_buf + 8));
        }
        else {
          (*(var->super_IRNode)._vptr_IRNode[0x1f])();
          pvVar7 = (void *)std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::size();
          local_78 = (Var *)hash_64_fnv1a(pvVar7,uVar5);
          bVar2 = Var::parametrized(var);
          if (!bVar2) {
            uVar4 = (*(var->super_IRNode)._vptr_IRNode[7])();
            local_78 = (Var *)((ulong)uVar4 ^ (ulong)local_78);
          }
          var_local = local_78;
          std::__cxx11::string::~string((string *)&hash);
        }
      }
    }
  }
  return (uint64_t)var_local;
}

Assistant:

static uint64_t hash_var(Var* var) {
    if (!var) return 0;
    if (var->type() == VarType::Expression) {
        auto* expr = reinterpret_cast<Expr*>(var);
        auto op_hash = (uint64_t)expr->op;
        return hash_var(expr->left) ^ hash_var(expr->right) ^ op_hash;
    } else if (var->type() == VarType::ConstValue) {
        auto* c = reinterpret_cast<Const*>(var);
        return static_cast<uint64_t>(c->value());
    } else if (var->type() == VarType::Parameter) {
        auto v = var->to_string();
        return hash_64_fnv1a(v.c_str(), v.size());
    } else {
        auto v = var->to_string();
        auto hash = hash_64_fnv1a(v.c_str(), v.size());
        if (!var->parametrized()) {
            hash ^= var->width();
        }
        return hash;
    }
}